

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64_na(char *s,size_t len)

{
  long lVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *s_00;
  long lVar11;
  ulong uVar12;
  uint128_c_t uVar13;
  uint128_c_t uVar14;
  
  if (0x20 < len) {
    if (len < 0x41) {
      lVar7 = len * 2 + -0x651e95c4d06fbfb1;
      lVar3 = *(long *)s * -0x651e95c4d06fbfb1;
      uVar6 = *(long *)(s + (len - 8)) * lVar7;
      uVar9 = lVar3 + *(long *)(s + 8);
      uVar10 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar5 = lVar3 + *(long *)(s + 0x18);
      uVar12 = (uVar6 >> 0x1e | uVar6 << 0x22) + (uVar9 >> 0x2b | uVar9 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
      uVar6 = (uVar10 >> 0x12 | uVar10 << 0x2e) + lVar3 + uVar6;
      uVar9 = (uVar12 ^ uVar6) * lVar7;
      uVar10 = (uVar12 + *(long *)(s + (len - 0x20))) * lVar7;
      uVar6 = (uVar9 >> 0x2f ^ uVar6 ^ uVar9) * lVar7;
      uVar9 = *(long *)(s + 0x10) * lVar7 + *(long *)(s + 0x18);
      uVar5 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)(s + 0x10) * lVar7 + uVar10;
      uVar9 = ((uVar10 >> 0x1e | uVar10 << 0x22) + (uVar9 >> 0x2b | uVar9 * 0x200000) +
               ((uVar6 >> 0x2f ^ uVar6) * lVar7 + *(long *)(s + (len - 0x18))) * lVar7 ^ uVar5) *
              lVar7;
      uVar9 = (uVar9 >> 0x2f ^ uVar5 ^ uVar9) * lVar7;
      uVar2 = (uVar9 >> 0x2f ^ uVar9) * lVar7;
    }
    else {
      lVar11 = *(long *)s + 0x1529cba0ca458ff;
      lVar3 = 0x226bb95b4e64b6d4;
      uVar5 = 0x134a747f856d0526;
      uVar13 = (uint128_c_t)ZEXT816(0);
      uVar9 = len - 1 & 0xffffffffffffffc0;
      uVar6 = (ulong)((uint)(len - 1) & 0x3f);
      s_00 = s + 0x20;
      lVar7 = uVar6 + uVar9;
      uVar14 = (uint128_c_t)ZEXT816(0);
      do {
        uVar5 = uVar5 + uVar14.a;
        uVar12 = lVar11 + uVar13.a + lVar3 + *(long *)(s_00 + -0x18);
        uVar10 = lVar3 + uVar13.b + *(long *)(s_00 + 0x10);
        lVar11 = (uVar5 >> 0x21 | uVar5 * 0x80000000) * -0x4b6d499041670d8d;
        uVar5 = (uVar12 >> 0x25 | uVar12 * 0x8000000) * -0x4b6d499041670d8d ^ uVar14.b;
        lVar3 = uVar13.a + *(long *)(s_00 + 8) +
                (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d;
        uVar13 = weak_farmhash_na_len_32_with_seeds
                           (s_00 + -0x20,uVar13.b * -0x4b6d499041670d8d,uVar14.a + uVar5);
        uVar14 = weak_farmhash_na_len_32_with_seeds
                           (s_00,uVar14.b + lVar11,*(long *)(s_00 + -0x10) + lVar3);
        s_00 = s_00 + 0x40;
        uVar9 = uVar9 - 0x40;
      } while (uVar9 != 0);
      lVar4 = uVar14.a + uVar6;
      lVar1 = (uVar5 & 0xff) * 2 + -0x4b6d499041670d8d;
      lVar8 = uVar13.a + lVar4;
      uVar9 = lVar3 + uVar13.b + *(long *)(s + lVar7 + -0xf);
      uVar6 = lVar11 + lVar3 + lVar8 + *(long *)(s + lVar7 + -0x37);
      lVar4 = lVar4 + lVar8;
      uVar5 = uVar5 + lVar4;
      uVar5 = uVar5 >> 0x21 | uVar5 * 0x80000000;
      uVar10 = lVar8 * 9 + *(long *)(s + lVar7 + -0x17) + (uVar9 >> 0x2a | uVar9 * 0x400000) * lVar1
      ;
      uVar6 = uVar14.b * 9 ^ (uVar6 >> 0x25 | uVar6 * 0x8000000) * lVar1;
      uVar13 = weak_farmhash_na_len_32_with_seeds(s + lVar7 + -0x3f,uVar13.b * lVar1,lVar4 + uVar6);
      uVar14 = weak_farmhash_na_len_32_with_seeds
                         (s + lVar7 + -0x1f,uVar5 * lVar1 + uVar14.b,
                          *(long *)(s + lVar7 + -0x2f) + uVar10);
      uVar12 = SUB168((undefined1  [16])uVar13 ^ (undefined1  [16])uVar14,0) * lVar1;
      uVar9 = SUB168((undefined1  [16])uVar13 ^ (undefined1  [16])uVar14,8) * lVar1;
      uVar12 = (uVar12 >> 0x2f ^ uVar14.a ^ uVar12) * lVar1;
      uVar9 = (uVar9 >> 0x2f ^ uVar14.b ^ uVar9) * lVar1;
      uVar9 = ((uVar9 >> 0x2f ^ uVar9) + uVar5) * lVar1;
      uVar9 = ((uVar10 >> 0x2f ^ uVar10) * -0x3c5a37a36834ced9 + uVar6 +
               (uVar12 >> 0x2f ^ uVar12) * lVar1 ^ uVar9) * lVar1;
      uVar9 = (uVar9 >> 0x2f ^ uVar9 ^ uVar9) * lVar1;
      uVar2 = (uVar9 >> 0x2f ^ uVar9) * lVar1;
    }
    return uVar2;
  }
  if (0x10 < len) {
    uVar2 = farmhash_na_len_17_to_32(s,len);
    return uVar2;
  }
  uVar2 = 0x9ae16a3b2f90404f;
  if (len < 8) {
    if (len < 4) {
      if (len != 0) {
        uVar9 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
        uVar2 = (uVar9 >> 0x2f ^ uVar9) * -0x651e95c4d06fbfb1;
      }
      return uVar2;
    }
    lVar7 = len * 2 + -0x651e95c4d06fbfb1;
    uVar9 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar7;
    uVar9 = (uVar9 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar9) * lVar7;
    uVar9 = uVar9 >> 0x2f ^ uVar9;
  }
  else {
    uVar9 = *(ulong *)(s + (len - 8));
    lVar7 = len * 2 + -0x651e95c4d06fbfb1;
    uVar5 = *(long *)s + 0x9ae16a3b2f90404f;
    uVar6 = ((uVar5 >> 0x19 | uVar5 << 0x27) + uVar9) * lVar7;
    uVar9 = ((uVar9 >> 0x25 | uVar9 << 0x1b) * lVar7 + uVar5 ^ uVar6) * lVar7;
    uVar9 = (uVar9 >> 0x2f ^ uVar6 ^ uVar9) * lVar7;
    uVar9 = uVar9 >> 0x2f ^ uVar9;
  }
  return uVar9 * lVar7;
}

Assistant:

uint64_t farmhash64_na(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_na_len_33_to_64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = smix(y * k2 + 113) * k2;
  uint128_c_t v = make_uint128_c_t(0, 0);
  uint128_c_t w = make_uint128_c_t(0, 0);
  x = x * k2 + fetch64(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_na_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.a += ((len - 1) & 63);
  v.a += w.a;
  w.a += v.a;
  x = ror64(x + y + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y + v.b + fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a * 9 + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  swap64(&z, &x);
  return farmhash_len_16_mul(farmhash_len_16_mul(v.a, w.a, mul) + smix(y) * k0 + z,
                   farmhash_len_16_mul(v.b, w.b, mul) + x,
                   mul);
}